

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

void __thiscall miniros::NodeHandle::initRemappings(NodeHandle *this,M_string *remappings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  NodeHandle *this_00;
  _Base_ptr p_Var3;
  string local_d0;
  string local_b0;
  NodeHandle *local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_48;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var3 = (remappings->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(remappings->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != local_38) {
    local_40 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->remappings_;
    paVar1 = &local_88.first.field_2;
    paVar2 = &local_88.second.field_2;
    local_48 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->unresolved_remappings_;
    local_90 = this;
    do {
      this_00 = local_90;
      resolveName(&local_b0,local_90,(string *)(p_Var3 + 1),false);
      resolveName(&local_d0,this_00,(string *)(p_Var3 + 2),false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        local_88.first.field_2._8_8_ = local_b0.field_2._8_8_;
        local_88.first._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_88.first._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_88.first.field_2._M_allocated_capacity._1_7_ =
           local_b0.field_2._M_allocated_capacity._1_7_;
      local_88.first.field_2._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
      local_88.first._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
        local_88.second.field_2._8_8_ = local_d0.field_2._8_8_;
        local_88.second._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_88.second._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      }
      local_88.second.field_2._M_allocated_capacity._1_7_ =
           local_d0.field_2._M_allocated_capacity._1_7_;
      local_88.second.field_2._M_local_buf[0] = local_d0.field_2._M_local_buf[0];
      local_88.second._M_string_length = local_d0._M_string_length;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_40,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.second._M_dataplus._M_p != paVar2) {
        operator_delete(local_88.second._M_dataplus._M_p,
                        local_88.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 2));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_48,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.second._M_dataplus._M_p != paVar2) {
        operator_delete(local_88.second._M_dataplus._M_p,
                        local_88.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_38);
  }
  return;
}

Assistant:

void NodeHandle::initRemappings(const M_string& remappings)
{
  {
    M_string::const_iterator it = remappings.begin();
    M_string::const_iterator end = remappings.end();
    for (; it != end; ++it)
    {
      const std::string& from = it->first;
      const std::string& to = it->second;

      remappings_.insert(std::make_pair(resolveName(from, false), resolveName(to, false)));
      unresolved_remappings_.insert(std::make_pair(from, to));
    }
  }
}